

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O1

void __thiscall WasmCGen::LoadStore(WasmCGen *this,PCSTR stack_type,PCSTR mem_type,bool loadOrStore)

{
  uint uVar1;
  pointer pcVar2;
  PCSTR pcVar3;
  PCSTR __s;
  undefined7 in_register_00000009;
  char *__s_00;
  char *pcVar4;
  char *__s_01;
  char *__s_02;
  char acStack_1c8 [104];
  undefined8 uStack_160;
  char local_158 [112];
  char local_e8 [112];
  PCSTR local_78;
  w3SourceGenStack *local_70;
  string local_68;
  int local_44;
  PCSTR local_40;
  allocator<char> local_31;
  
  __s_00 = local_158;
  uStack_160 = 0x114fb9;
  local_40 = stack_type;
  printf("/*%s*/\n","LoadStore");
  (this->super_w3SourceGen).temp = (this->super_w3SourceGen).temp + 1;
  uStack_160 = 0x114fdc;
  sprintf(local_158,"temp%ld");
  (this->super_w3SourceGen).temp = (this->super_w3SourceGen).temp + 1;
  uStack_160 = 0x114ff8;
  sprintf(local_e8,"temp%ld");
  local_44 = (int)CONCAT71(in_register_00000009,loadOrStore);
  pcVar4 = (char *)0x0;
  local_78 = mem_type;
  if (local_44 != 0) {
    __s_00 = acStack_1c8;
    (this->super_w3SourceGen).temp = (this->super_w3SourceGen).temp + 1;
    sprintf(__s_00,"temp%ld");
    pcVar4 = __s_00;
  }
  __s_01 = __s_00 + -0x70;
  (this->super_w3SourceGen).temp = (this->super_w3SourceGen).temp + 1;
  __s_00[-0x78] = 'T';
  __s_00[-0x77] = 'P';
  __s_00[-0x76] = '\x11';
  __s_00[-0x75] = '\0';
  __s_00[-0x74] = '\0';
  __s_00[-0x73] = '\0';
  __s_00[-0x72] = '\0';
  __s_00[-0x71] = '\0';
  sprintf(__s_01,"temp%ld");
  __s_02 = __s_00 + -0xe0;
  (this->super_w3SourceGen).temp = (this->super_w3SourceGen).temp + 1;
  builtin_strncpy(__s_00 + -0xe8,"vP\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  sprintf(__s_02,"temp%ld");
  uVar1 = (((this->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).field_0
          .field_6.offset;
  __s_00[-0xe8] = -0x6e;
  __s_00[-0xe7] = 'P';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("const long %s = %u;\n",local_158,(ulong)uVar1);
  local_70 = &(this->super_w3SourceGen).stack;
  __s_00[-0xe8] = -0x5a;
  __s_00[-0xe7] = 'P';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  w3SourceGenStack::pop_abi_cxx11_(&local_68,local_70);
  __s_00[-0xe8] = -0x42;
  __s_00[-0xe7] = 'P';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("const long %s = %s;\n",local_e8,local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    __s_00[-0xe8] = -0x2a;
    __s_00[-0xe7] = 'P';
    __s_00[-0xe6] = '\x11';
    __s_00[-0xe5] = '\0';
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  __s_00[-0xe8] = -0x19;
  __s_00[-0xe7] = 'P';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("long %s;\n",__s_01);
  __s_00[-0xe8] = -4;
  __s_00[-0xe7] = 'P';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("%s %s;\n",local_40,pcVar4);
  builtin_strncpy(__s_00 + -0xe8,"\x14Q\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("if (%s >= 0)\n{\n",local_e8);
  builtin_strncpy(__s_00 + -0xe8,"6Q\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  local_40 = pcVar4;
  printf("  %s = %s + (uint32_t)%s;\n",__s_01,local_158,local_e8);
  builtin_strncpy(__s_00 + -0xe8,"JQ\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("  if (%s < %s) Overflow();",__s_01,local_158);
  builtin_strncpy(__s_00 + -0xe8,"VQ\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  puts("\n}\nelse\n{");
  builtin_strncpy(__s_00 + -0xe8,"jQ\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("  const size_t %s = int_magnitude (%s);\n",__s_02,local_e8);
  builtin_strncpy(__s_00 + -0xe8,"~Q\x11",4);
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("  if (%s > %s) Overflow();\n",__s_02,local_158);
  __s_00[-0xe8] = -0x6b;
  __s_00[-0xe7] = 'Q';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("  %s = %s - %s;",__s_01,local_158,__s_02);
  __s_00[-0xe8] = -0x5f;
  __s_00[-0xe7] = 'Q';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  puts("\n}");
  pcVar3 = local_78;
  __s_00[-0xe8] = -0x47;
  __s_00[-0xe7] = 'Q';
  __s_00[-0xe6] = '\x11';
  __s_00[-0xe5] = '\0';
  __s_00[-0xe4] = '\0';
  __s_00[-0xe3] = '\0';
  __s_00[-0xe2] = '\0';
  __s_00[-0xe1] = '\0';
  printf("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n",__s_01,local_78);
  __s = local_40;
  pcVar2 = (this->module->name)._M_dataplus._M_p;
  if ((char)local_44 == '\0') {
    builtin_strncpy(__s_00 + -0xe8,"\x1cR\x11",4);
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    w3SourceGenStack::pop_abi_cxx11_(&local_68,local_70);
    builtin_strncpy(__s_00 + -0xe8,"6R\x11",4);
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    printf("*(%s*)(%s + (PCH)%s_mem = %s;\n",pcVar3,__s_01,pcVar2,local_68._M_dataplus._M_p);
  }
  else {
    __s_00[-0xe8] = -0x18;
    __s_00[-0xe7] = 'Q';
    __s_00[-0xe6] = '\x11';
    __s_00[-0xe5] = '\0';
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    printf("%s = *(%s*)(%s + (PCH)%s_mem;\n",local_40,pcVar3,__s_01,pcVar2);
    __s_00[-0xe8] = -5;
    __s_00[-0xe7] = 'Q';
    __s_00[-0xe6] = '\x11';
    __s_00[-0xe5] = '\0';
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_31);
    builtin_strncpy(__s_00 + -0xe8,"\x06R\x11",4);
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    w3SourceGen::push(&this->super_w3SourceGen,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    builtin_strncpy(__s_00 + -0xe8,"NR\x11",4);
    __s_00[-0xe4] = '\0';
    __s_00[-0xe3] = '\0';
    __s_00[-0xe2] = '\0';
    __s_00[-0xe1] = '\0';
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WasmCGen::LoadStore (PCSTR stack_type, PCSTR mem_type, bool loadOrStore)
{
    printf ("/*%s*/\n", __func__);
    PCSTR offset = TEMP();
    PCSTR i = TEMP();
    PCSTR result = loadOrStore ? TEMP() : 0;
    PCSTR effective_address = TEMP();
    PCSTR u = TEMP();

    printf ("const long %s = %u;\n", offset, instr->offset);
    printf ("const long %s = %s;\n", i, pop().c_str());
    printf ("long %s;\n", effective_address);
    printf ("%s %s;\n", stack_type, result);

    printf ("if (%s >= 0)\n{\n", i);
    printf ("  %s = %s + (uint32_t)%s;\n", effective_address, offset, i);
    printf ("  if (%s < %s) Overflow();", effective_address, offset);
    printf ("\n}\nelse\n{\n");
    printf ("  const size_t %s = int_magnitude (%s);\n", u, i);
    printf ("  if (%s > %s) Overflow();\n", u, offset);
    printf ("  %s = %s - %s;", effective_address, offset, u);
    printf ("\n}\n");

    printf ("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n", effective_address, mem_type);

    PCSTR load[4] = {result, mem_type, effective_address, module->name.c_str()};

    if (loadOrStore)
    {
        printf ("%s = *(%s*)(%s + (PCH)%s_mem;\n", load[0], load[1], load[2], load[3]);
        push(result);
    }
    else
    {
        printf ("*(%s*)(%s + (PCH)%s_mem = %s;\n", load[1], load[2], load[3], pop().c_str());
    }
}